

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O3

void __thiscall
Assimp::IFC::TempMesh::ComputePolygonNormals
          (TempMesh *this,vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *normals,
          bool normalize,size_t ofs)

{
  pointer *ppaVar1;
  uint *puVar2;
  iterator iVar3;
  pointer paVar4;
  IfcVector3 *n;
  uint *puVar5;
  long lVar6;
  pointer paVar7;
  long lVar8;
  ulong uVar9;
  double *pdVar10;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range3;
  uint uVar11;
  ulong uVar12;
  size_type __n;
  uint *puVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  vector<double,_std::allocator<double>_> temp;
  vector<double,_std::allocator<double>_> local_60;
  aiVector3t<double> local_48;
  
  puVar13 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start + ofs;
  puVar2 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar13 == puVar2) {
    __n = 8;
  }
  else {
    uVar12 = 0;
    puVar5 = puVar13;
    do {
      uVar9 = (ulong)*puVar5;
      if (*puVar5 < uVar12) {
        uVar9 = uVar12;
      }
      puVar5 = puVar5 + 1;
      uVar12 = uVar9;
    } while (puVar5 != puVar2);
    __n = uVar9 * 4 + 8;
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_60,__n,(allocator_type *)&local_48);
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (normals,(((long)(normals->
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(normals->
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                     - ofs) + ((long)(this->mVertcnt).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->mVertcnt).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2));
  puVar5 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = 0;
  if (puVar5 != puVar13) {
    do {
      uVar11 = (int)uVar12 + *puVar5;
      uVar12 = (ulong)uVar11;
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar13);
    uVar12 = (ulong)(int)uVar11;
  }
  for (; puVar13 != puVar2; puVar13 = puVar13 + 1) {
    if (*puVar13 == 0) {
      local_48.x = 0.0;
      local_48.y = 0.0;
      local_48.z = 0.0;
      iVar3._M_current =
           (normals->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (normals->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)normals,iVar3,
                   &local_48);
      }
      else {
        (iVar3._M_current)->x = 0.0;
        (iVar3._M_current)->y = 0.0;
        (iVar3._M_current)->z = 0.0;
        ppaVar1 = &(normals->
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
    }
    else {
      lVar6 = uVar12 * 0x18 + 0x10;
      lVar8 = 0;
      uVar9 = 0;
      do {
        paVar7 = (this->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)
         ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar8) =
             *(undefined8 *)((long)paVar7 + lVar6 + -0x10);
        *(undefined8 *)
         ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar8 + 8) =
             *(undefined8 *)((long)paVar7 + lVar6 + -8);
        *(undefined8 *)
         ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar8 + 0x10) =
             *(undefined8 *)((long)&paVar7->x + lVar6);
        *(undefined8 *)
         ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar8 + 0x18) = 0x7ff8000000000000;
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x20;
        lVar6 = lVar6 + 0x18;
      } while (uVar9 < *puVar13);
      local_48.x = 0.0;
      local_48.y = 0.0;
      local_48.z = 0.0;
      iVar3._M_current =
           (normals->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (normals->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)normals,iVar3,
                   &local_48);
        paVar7 = (normals->
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (iVar3._M_current)->x = 0.0;
        (iVar3._M_current)->y = 0.0;
        (iVar3._M_current)->z = 0.0;
        paVar7 = (normals->
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish + 1;
        (normals->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = paVar7;
      }
      uVar11 = *puVar13;
      uVar9 = (ulong)(int)uVar11;
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar9 * 4] =
           *local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
      lVar6 = (long)(int)(uVar11 * 4 + 4);
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[4];
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar9 * 4 + 1] =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[1];
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6 + 1] =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[5];
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar9 * 4 + 2] =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[2];
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6 + 2] =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[6];
      if ((long)uVar9 < 1) {
        dVar14 = 0.0;
        dVar15 = 0.0;
        dVar16 = 0.0;
      }
      else {
        pdVar10 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + 10;
        dVar14 = 0.0;
        dVar15 = 0.0;
        dVar16 = 0.0;
        do {
          dVar16 = dVar16 + (pdVar10[-1] - pdVar10[-9]) * pdVar10[-6];
          dVar14 = dVar14 + (*pdVar10 - pdVar10[-8]) * pdVar10[-5];
          dVar15 = dVar15 + (pdVar10[-2] - pdVar10[-10]) * pdVar10[-4];
          pdVar10 = pdVar10 + 4;
          uVar11 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar11;
        } while (uVar11 != 0);
      }
      paVar7[-1].x = dVar14;
      paVar7[-1].y = dVar15;
      paVar7[-1].z = dVar16;
    }
    uVar12 = uVar12 + *puVar13;
  }
  if (normalize) {
    paVar4 = (normals->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    for (paVar7 = (normals->
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_start; paVar7 != paVar4; paVar7 = paVar7 + 1) {
      dVar14 = paVar7->z;
      dVar15 = paVar7->x;
      dVar16 = paVar7->y;
      dVar17 = 1.0 / SQRT(dVar14 * dVar14 + dVar15 * dVar15 + dVar16 * dVar16);
      paVar7->x = dVar17 * dVar15;
      paVar7->y = dVar17 * dVar16;
      paVar7->z = dVar14 * dVar17;
    }
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TempMesh::ComputePolygonNormals(std::vector<IfcVector3>& normals,
    bool normalize,
    size_t ofs) const
{
    size_t max_vcount = 0;
    std::vector<unsigned int>::const_iterator begin = mVertcnt.begin()+ofs, end = mVertcnt.end(),  iit;
    for(iit = begin; iit != end; ++iit) {
        max_vcount = std::max(max_vcount,static_cast<size_t>(*iit));
    }

    std::vector<IfcFloat> temp((max_vcount+2)*4);
    normals.reserve( normals.size() + mVertcnt.size()-ofs );

    // `NewellNormal()` currently has a relatively strange interface and need to
    // re-structure things a bit to meet them.
    size_t vidx = std::accumulate(mVertcnt.begin(),begin,0);
    for(iit = begin; iit != end; vidx += *iit++) {
        if (!*iit) {
            normals.push_back(IfcVector3());
            continue;
        }
        for(size_t vofs = 0, cnt = 0; vofs < *iit; ++vofs) {
            const IfcVector3& v = mVerts[vidx+vofs];
            temp[cnt++] = v.x;
            temp[cnt++] = v.y;
            temp[cnt++] = v.z;
#ifdef ASSIMP_BUILD_DEBUG
            temp[cnt] = std::numeric_limits<IfcFloat>::quiet_NaN();
#endif
            ++cnt;
        }

        normals.push_back(IfcVector3());
        NewellNormal<4,4,4>(normals.back(),*iit,&temp[0],&temp[1],&temp[2]);
    }

    if(normalize) {
        for(IfcVector3& n : normals) {
            n.Normalize();
        }
    }
}